

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O2

void zzRedCrandMont_fast(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  word *pwVar1;
  ulong *puVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  word wVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  
  uVar8 = 0;
  uVar11 = 0;
  for (sVar10 = 0; n != sVar10; sVar10 = sVar10 + 1) {
    uVar9 = a[sVar10] * mont_param;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar9;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = -*mod;
    if (!CARRY8(uVar9,uVar8)) {
      pwVar1 = a + n + sVar10;
      uVar3 = *pwVar1;
      *pwVar1 = *pwVar1 + uVar9 + uVar8;
      uVar8 = (ulong)CARRY8(uVar3,uVar9 + uVar8);
    }
    uVar11 = uVar11 + SUB168(auVar4 * auVar5,8);
    puVar2 = a + sVar10 + 1;
    uVar9 = *puVar2;
    *puVar2 = *puVar2 - uVar11;
    uVar11 = (ulong)(uVar9 < uVar11);
  }
  wVar7 = zzSubW2(a + n + 1,n - 1,uVar11);
  wwCopy(a,a + n,n);
  a[n] = uVar8 - wVar7;
  iVar6 = wwCmp2(a,n + 1,mod,n);
  if (-1 < iVar6) {
    zzSub2(a,mod,n);
    return;
  }
  return;
}

Assistant:

void FAST(zzRedCrandMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word borrow = 0;
	register dword prod;
	register word w;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n >= 2 && mod[0] % 2  && wwIsRepW(mod + 1, n - 1, WORD_MAX));
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		zzMul11(prod, w, WORD_0 - mod[0]);
		w += carry;
		if (w >= carry)
			a[i + n] += w, carry = a[i + n] < w;
		w = (word)(prod >> B_PER_W);
		w += borrow;
		if (w >= borrow)
			borrow = a[i + 1] < w, a[i + 1] -= w;
	}
	// a <- a - borrow * B^{n + 1}
	carry -= zzSubW2(a + n + 1, n - 1, borrow);
	// a <- a / B^n
	wwCopy(a, a + n, n);
	a[n] = carry;
	// a >= mod?
	if (wwCmp2(a, n + 1, mod, n) >= 0)
		// a <- a - mod
		zzSub2(a, mod, n);
	// очистка
	prod = 0;
	carry = borrow = w = 0;
}